

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O1

EbmlElement *
libebml::EbmlElement::FindNextID
          (IOCallback *DataStream,EbmlCallbacks *ClassInfos,uint64 MaxDataSize)

{
  uint64 uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64 uVar4;
  ulong uVar5;
  EbmlBinary *this;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  binary PossibleId [4];
  uint64 SizeUnknown;
  binary PossibleSize [8];
  uint local_80;
  byte local_7c [4];
  ulong local_78;
  uint64 local_70;
  uint64 local_68;
  uint64 local_60;
  binary local_58 [8];
  EbmlCallbacks *local_50;
  uint64 local_48;
  ulong local_40;
  uint64 local_38;
  
  local_60 = 0;
  uVar7 = 0;
  local_78 = 0;
  local_48 = 0;
  local_40 = 0;
  local_70 = 0;
  local_50 = ClassInfos;
  local_38 = MaxDataSize;
LAB_0018333f:
  iVar2 = (*DataStream->_vptr_IOCallback[5])(DataStream);
  uVar9 = (ulong)(int)uVar7;
  uVar3 = (*DataStream->_vptr_IOCallback[2])(DataStream,local_7c + uVar9,1);
  if (uVar3 != uVar7) {
    local_68 = CONCAT44(extraout_var,iVar2);
    if ((int)uVar7 < 5) {
      uVar7 = 4;
    }
    uVar7 = uVar7 + 1;
    uVar8 = 0x80;
    do {
      if (3 < (long)uVar9) {
        bVar10 = false;
        uVar4 = local_68;
        goto LAB_001834c4;
      }
      if ((uVar8 & local_7c[0]) != 0) {
        iVar2 = (*DataStream->_vptr_IOCallback[5])(DataStream);
        uVar4 = CONCAT44(extraout_var_00,iVar2);
        local_48 = uVar4;
        uVar7 = (uint)local_78;
        bVar10 = uVar7 < 8;
        if (!bVar10) goto LAB_001834b2;
        uVar5 = local_78 & 0xffffffff;
        (*DataStream->_vptr_IOCallback[2])(DataStream,local_58 + uVar5,1);
        local_80 = uVar7 + 1;
        uVar4 = ReadCodedSizeValue(local_58,&local_80,&local_60);
        local_70 = uVar4;
        if (local_80 == 0) {
          lVar6 = 0;
          goto LAB_00183440;
        }
        local_78 = (ulong)(uVar7 + 1);
        goto LAB_001834b2;
      }
      uVar8 = uVar8 >> 1;
      iVar2 = (*DataStream->_vptr_IOCallback[2])(DataStream,local_7c + uVar9 + 1,1);
      uVar3 = uVar3 + iVar2;
      uVar9 = uVar9 + 1;
    } while ((uint)uVar9 != uVar3);
    bVar10 = false;
    goto LAB_001834bc;
  }
  bVar10 = false;
  uVar4 = CONCAT44(extraout_var,iVar2);
  goto LAB_001834c4;
  while( true ) {
    (*DataStream->_vptr_IOCallback[2])(DataStream,local_58 + lVar6 + uVar5 + 1,1);
    local_80 = uVar7 + (int)lVar6 + 2;
    local_70 = ReadCodedSizeValue(local_58,&local_80,&local_60);
    lVar6 = lVar6 + 1;
    if (local_80 != 0) break;
LAB_00183440:
    bVar10 = uVar5 + lVar6 < 7;
    if (uVar5 + lVar6 == 7) {
      uVar4 = 0;
      local_78 = 8;
      goto LAB_001834b2;
    }
  }
  uVar4 = (uVar5 + lVar6) - 1;
  bVar10 = uVar4 < 7;
  local_78 = (ulong)(uVar7 + (int)lVar6 + 1);
LAB_001834b2:
  uVar9 = (ulong)((int)uVar9 + 1);
  local_40 = CONCAT71((int7)(uVar4 >> 8),1);
LAB_001834bc:
  uVar7 = (uint)uVar9;
  uVar4 = local_68;
LAB_001834c4:
  if (!bVar10) {
    return (EbmlElement *)0x0;
  }
  if ((local_40 & 1) != 0) goto code_r0x001834d7;
  goto LAB_0018333f;
code_r0x001834d7:
  uVar9 = (ulong)uVar7;
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 << 8 | (uint)local_7c[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
  }
  iVar2 = (int)local_78;
  if ((local_50->GlobalId->Length == uVar9) && (local_50->GlobalId->Value == uVar7)) {
    this = (EbmlBinary *)(*local_50->Create)();
  }
  else {
    this = (EbmlBinary *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    if (this == (EbmlBinary *)0x0) {
      this = (EbmlBinary *)0x0;
    }
    else {
      EbmlBinary::EbmlBinary(this);
      (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlBinary_001ce2c8;
      *(uint *)&this[1].super_EbmlElement._vptr_EbmlElement = uVar7;
      this[1].super_EbmlElement.Size = uVar9;
    }
    if (this == (EbmlBinary *)0x0) {
      return (EbmlElement *)0x0;
    }
  }
  uVar1 = local_70;
  (this->super_EbmlElement).SizeLength = iVar2;
  (this->super_EbmlElement).Size = local_70;
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[7])(this);
  if ((char)iVar2 != '\0') {
    if (uVar1 != local_60) {
      if (local_38 < (this->super_EbmlElement).Size) goto LAB_001835ab;
      if (uVar1 != local_60) {
        (*(this->super_EbmlElement)._vptr_EbmlElement[6])(this,0);
        goto LAB_001835d9;
      }
    }
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[6])(this,1);
    if ((char)iVar2 != '\0') {
LAB_001835d9:
      (this->super_EbmlElement).ElementPosition = uVar4;
      (this->super_EbmlElement).SizePosition = local_48;
      return &this->super_EbmlElement;
    }
  }
LAB_001835ab:
  (*(this->super_EbmlElement)._vptr_EbmlElement[1])(this);
  return (EbmlElement *)0x0;
}

Assistant:

EbmlElement * EbmlElement::FindNextID(IOCallback & DataStream, const EbmlCallbacks & ClassInfos, uint64 MaxDataSize)
{
  binary PossibleId[4];
  int PossibleID_Length = 0;
  binary PossibleSize[8]; // we don't support size stored in more than 64 bits
  uint32 PossibleSizeLength = 0;
  uint64 SizeUnknown = 0;
  uint64 SizeFound = 0;
  bool bElementFound = false;

  binary BitMask;
  uint64 aElementPosition = 0, aSizePosition = 0;
  while (!bElementFound) {
    // read ID
    aElementPosition = DataStream.getFilePointer();
    uint32 ReadSize = 0;
    BitMask = 1 << 7;
    while (1) {
      ReadSize += DataStream.read(&PossibleId[PossibleID_Length], 1);
      if (ReadSize == uint32(PossibleID_Length)) {
        return NULL; // no more data ?
      }
      if (++PossibleID_Length > 4) {
        return NULL; // we don't support element IDs over class D
      }
      if (PossibleId[0] & BitMask) {
        // this is the last octet of the ID
        // check wether that's the one we're looking for
/*      if (PossibleID == EBML_INFO_ID(ClassInfos)) {
          break;
        } else {
          /// \todo This element should be skipped (use a context ?)
        }*/
        bElementFound = true; /// \todo not exactly the one we're looking for
        break;
      }
      BitMask >>= 1;
    }

    // read the data size
    aSizePosition = DataStream.getFilePointer();
    uint32 _SizeLength;
    do {
      if (PossibleSizeLength >= 8)
        // Size is larger than 8 bytes
        return NULL;

      ReadSize += DataStream.read(&PossibleSize[PossibleSizeLength++], 1);
      _SizeLength = PossibleSizeLength;
      SizeFound = ReadCodedSizeValue(&PossibleSize[0], _SizeLength, SizeUnknown);
    } while (_SizeLength == 0);
  }

  EbmlElement *Result = NULL;
  EbmlId PossibleID(PossibleId, PossibleID_Length);
  if (PossibleID == EBML_INFO_ID(ClassInfos)) {
    // the element is the one expected
    Result = &EBML_INFO_CREATE(ClassInfos);
  } else {
    /// \todo find the element in the context
    Result = new (std::nothrow) EbmlDummy(PossibleID);
    if(Result == NULL)
      return NULL;
  }

  Result->SetSizeLength(PossibleSizeLength);

  Result->Size = SizeFound;

  if (!Result->ValidateSize() || (SizeFound != SizeUnknown && MaxDataSize < Result->Size)) {
    delete Result;
    return NULL;
  }

  // check if the size is not all 1s
  if (SizeFound == SizeUnknown) {
    // Size of this element is unknown
    // only possible for Master elements
    if (!Result->SetSizeInfinite()) {
      /// \todo the element is not allowed to be infinite
      delete Result;
      return NULL;
    }
  } else Result->SetSizeInfinite(false);
  Result->ElementPosition = aElementPosition;
  Result->SizePosition = aSizePosition;

  return Result;
}